

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> __thiscall
wabt::interp::EventType::Clone(EventType *this)

{
  EventType *in_RSI;
  unique_ptr<wabt::interp::EventType,_std::default_delete<wabt::interp::EventType>_> local_20 [2];
  EventType *this_local;
  
  this_local = this;
  MakeUnique<wabt::interp::EventType,wabt::interp::EventType_const&>((wabt *)local_20,in_RSI);
  std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
  unique_ptr<wabt::interp::EventType,std::default_delete<wabt::interp::EventType>,void>
            ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *)
             this,local_20);
  std::unique_ptr<wabt::interp::EventType,_std::default_delete<wabt::interp::EventType>_>::
  ~unique_ptr(local_20);
  return (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<ExternType> EventType::Clone() const {
  return MakeUnique<EventType>(*this);
}